

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::parse_args
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  bool bVar2;
  reference __in;
  type *this_00;
  pointer this_01;
  reference pMVar3;
  size_type sVar4;
  reference ppAVar5;
  runtime_error *prVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Argument *local_1c0;
  Argument *arg_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *__range4;
  size_t size;
  size_t i;
  string argument_names;
  string local_168;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Argument *local_98;
  Argument *arg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *__range3;
  Argument *mutex_argument_it;
  bool mutex_argument_used;
  MutuallyExclusiveGroup *group;
  iterator __end2_1;
  iterator __begin2_1;
  vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  *__range2_1;
  type *argument;
  type *unused;
  _Self local_30;
  iterator __end2;
  iterator __begin2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  ArgumentParser *this_local;
  
  parse_args_internal(this,arguments);
  __end2 = std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::begin(&this->m_argument_map);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::end(&this->m_argument_map);
  while (bVar1 = std::operator==(&__end2,&local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
           ::operator*(&__end2);
    std::
    get<0ul,std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>
              (__in);
    this_00 = std::
              get<1ul,std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>
                        (__in);
    this_01 = std::_List_iterator<argparse::Argument>::operator->(this_00);
    Argument::validate(this_01);
    std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
             ::begin(&this->m_mutually_exclusive_groups);
  group = (MutuallyExclusiveGroup *)
          std::
          vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
          ::end(&this->m_mutually_exclusive_groups);
  do {
    bVar1 = __gnu_cxx::
            operator==<argparse::ArgumentParser::MutuallyExclusiveGroup_*,_std::vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>_>
                      (&__end2_1,
                       (__normal_iterator<argparse::ArgumentParser::MutuallyExclusiveGroup_*,_std::vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>_>
                        *)&group);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pMVar3 = __gnu_cxx::
             __normal_iterator<argparse::ArgumentParser::MutuallyExclusiveGroup_*,_std::vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>_>
             ::operator*(&__end2_1);
    bVar1 = false;
    __range3 = (vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)0x0;
    __end3 = std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>::begin
                       ((vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)
                        (pMVar3 + 0x10));
    arg = (Argument *)
          std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>::end
                    ((vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)
                     (pMVar3 + 0x10));
    while (bVar2 = __gnu_cxx::
                   operator==<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
                             (&__end3,(__normal_iterator<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
                                       *)&arg), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppAVar5 = __gnu_cxx::
                __normal_iterator<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
                ::operator*(&__end3);
      local_98 = *ppAVar5;
      if ((bVar1) || (((byte)local_98->field_0x140 >> 4 & 1) == 0)) {
        if ((bVar1) && (((byte)local_98->field_0x140 >> 4 & 1) != 0)) {
          argument_names.field_2._M_local_buf[0xf] = '\x01';
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          Argument::get_usage_full_abi_cxx11_(&local_138,local_98);
          std::operator+(&local_118,"Argument \'",&local_138);
          std::operator+(&local_f8,&local_118,"\' not allowed with \'");
          Argument::get_usage_full_abi_cxx11_(&local_168,(Argument *)__range3);
          std::operator+(&local_d8,&local_f8,&local_168);
          std::operator+(&local_b8,&local_d8,"\'");
          std::runtime_error::runtime_error(prVar6,(string *)&local_b8);
          argument_names.field_2._M_local_buf[0xf] = '\0';
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        bVar1 = true;
        __range3 = (vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)local_98;
      }
      __gnu_cxx::
      __normal_iterator<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
      ::operator++(&__end3);
    }
    if ((!bVar1) && (((byte)pMVar3[8] & 1) != 0)) {
      std::__cxx11::string::string((string *)&i);
      size = 0;
      sVar4 = std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>::size
                        ((vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)
                         (pMVar3 + 0x10));
      __end4 = std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>::begin
                         ((vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)
                          (pMVar3 + 0x10));
      arg_1 = (Argument *)
              std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>::end
                        ((vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_> *)
                         (pMVar3 + 0x10));
      while (bVar1 = __gnu_cxx::
                     operator==<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
                               (&__end4,(__normal_iterator<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
                                         *)&arg_1), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppAVar5 = __gnu_cxx::
                  __normal_iterator<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
                  ::operator*(&__end4);
        local_1c0 = *ppAVar5;
        if (size + 1 == sVar4) {
          Argument::get_usage_full_abi_cxx11_(&local_220,local_1c0);
          std::operator+(&local_200,"\'",&local_220);
          std::operator+(&local_1e0,&local_200,"\' ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     &local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
        }
        else {
          Argument::get_usage_full_abi_cxx11_(&local_280,local_1c0);
          std::operator+(&local_260,"\'",&local_280);
          std::operator+(&local_240,&local_260,"\' or ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     &local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_280);
        }
        size = size + 1;
        __gnu_cxx::
        __normal_iterator<argparse::Argument_*const_*,_std::vector<argparse::Argument_*,_std::allocator<argparse::Argument_*>_>_>
        ::operator++(&__end4);
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_2c0,"One of the arguments ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      std::operator+(&local_2a0,&local_2c0,"is required");
      std::runtime_error::runtime_error(prVar6,(string *)&local_2a0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __gnu_cxx::
    __normal_iterator<argparse::ArgumentParser::MutuallyExclusiveGroup_*,_std::vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void parse_args(const std::vector<std::string> &arguments) {
    parse_args_internal(arguments);
    // Check if all arguments are parsed
    for ([[maybe_unused]] const auto &[unused, argument] : m_argument_map) {
      argument->validate();
    }

    // Check each mutually exclusive group and make sure
    // there are no constraint violations
    for (const auto &group : m_mutually_exclusive_groups) {
      auto mutex_argument_used{false};
      Argument *mutex_argument_it{nullptr};
      for (Argument *arg : group.m_elements) {
        if (!mutex_argument_used && arg->m_is_used) {
          mutex_argument_used = true;
          mutex_argument_it = arg;
        } else if (mutex_argument_used && arg->m_is_used) {
          // Violation
          throw std::runtime_error("Argument '" + arg->get_usage_full() +
                                   "' not allowed with '" +
                                   mutex_argument_it->get_usage_full() + "'");
        }
      }

      if (!mutex_argument_used && group.m_required) {
        // at least one argument from the group is
        // required
        std::string argument_names{};
        std::size_t i = 0;
        std::size_t size = group.m_elements.size();
        for (Argument *arg : group.m_elements) {
          if (i + 1 == size) {
            // last
            argument_names += "'" + arg->get_usage_full() + "' ";
          } else {
            argument_names += "'" + arg->get_usage_full() + "' or ";
          }
          i += 1;
        }
        throw std::runtime_error("One of the arguments " + argument_names +
                                 "is required");
      }
    }
  }